

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O2

Aig_Obj_t ** Aig_ManStaticFanoutStart(Aig_Man_t *p)

{
  Aig_Obj_t **ppAVar1;
  void *pvVar2;
  Aig_Obj_t *pFan;
  int iVar3;
  int i;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *p_00;
  
  p_00 = p->vObjs;
  iVar5 = p_00->nSize;
  iVar3 = iVar5 * 2 - (p->nObjs[2] + p->nObjs[3]);
  ppAVar1 = (Aig_Obj_t **)malloc((long)iVar3 << 3);
  iVar4 = 0;
  for (i = 0; i < iVar5; i = i + 1) {
    pvVar2 = Vec_PtrEntry(p_00,i);
    if (pvVar2 != (void *)0x0) {
      *(Aig_Obj_t ***)((long)pvVar2 + 0x28) = ppAVar1 + iVar4;
      iVar4 = iVar4 + ((uint)(*(ulong *)((long)pvVar2 + 0x18) >> 6) & 0x3ffffff);
      *(ulong *)((long)pvVar2 + 0x18) = *(ulong *)((long)pvVar2 + 0x18) & 0xffffffff0000003f;
    }
    p_00 = p->vObjs;
    iVar5 = p_00->nSize;
  }
  if (iVar4 < iVar3) {
    for (iVar3 = 0; iVar3 < iVar5; iVar3 = iVar3 + 1) {
      pFan = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar3);
      if (pFan != (Aig_Obj_t *)0x0) {
        if (pFan->pFanin0 != (Aig_Obj_t *)0x0) {
          Aig_ObjSetFanoutStatic((Aig_Obj_t *)((ulong)pFan->pFanin0 & 0xfffffffffffffffe),pFan);
        }
        if (pFan->pFanin1 != (Aig_Obj_t *)0x0) {
          Aig_ObjSetFanoutStatic((Aig_Obj_t *)((ulong)pFan->pFanin1 & 0xfffffffffffffffe),pFan);
        }
      }
      p_00 = p->vObjs;
      iVar5 = p_00->nSize;
    }
    return ppAVar1;
  }
  __assert_fail("nFanouts < nFanoutsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetFwd.c"
                ,0x42,"Aig_Obj_t **Aig_ManStaticFanoutStart(Aig_Man_t *)");
}

Assistant:

Aig_Obj_t ** Aig_ManStaticFanoutStart( Aig_Man_t * p )
{
    Aig_Obj_t ** ppFanouts, * pObj;
    int i, nFanouts, nFanoutsAlloc;
    // allocate fanouts
    nFanoutsAlloc = 2 * Aig_ManObjNumMax(p) - Aig_ManCiNum(p) - Aig_ManCoNum(p);
    ppFanouts = ABC_ALLOC( Aig_Obj_t *, nFanoutsAlloc );
    // mark up storage
    nFanouts = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        pObj->pData = ppFanouts + nFanouts;
        nFanouts += pObj->nRefs;  
        pObj->nRefs = 0;
    }
    assert( nFanouts < nFanoutsAlloc ); 
    // add fanouts
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjChild0(pObj) )
            Aig_ObjSetFanoutStatic( Aig_ObjFanin0(pObj), pObj );
        if ( Aig_ObjChild1(pObj) )
            Aig_ObjSetFanoutStatic( Aig_ObjFanin1(pObj), pObj );
    }
    return ppFanouts;
}